

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall bytearray_undo_rec::~bytearray_undo_rec(bytearray_undo_rec *this)

{
  bytearray_undo_bytes *pbVar1;
  bytearray_undo_bytes *__ptr;
  
  __ptr = this->save_head_;
  while (__ptr != (bytearray_undo_bytes *)0x0) {
    pbVar1 = __ptr->nxt_;
    free(__ptr);
    __ptr = pbVar1;
  }
  return;
}

Assistant:

~bytearray_undo_rec()
    {
        bytearray_undo_bytes *cur;
        bytearray_undo_bytes *nxt;

        /* delete our list of saved byte blocks */
        for (cur = save_head_ ; cur != 0 ; cur = nxt)
        {
            /* 
             *   remember the next one, as we're about to lose the current
             *   one's memory 
             */
            nxt = cur->nxt_;

            /* delete this one */
            t3free(cur);
        }
    }